

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

void __thiscall BVSparse<Memory::Recycler>::ClearAll(BVSparse<Memory::Recycler> *this)

{
  BVSparseNode<Memory::Recycler> *pBVar1;
  BVSparseNode *curNode;
  
  curNode = (this->head).ptr;
  while (curNode != (BVSparseNode *)0x0) {
    pBVar1 = (curNode->next).ptr;
    QueueInFreeList(this,curNode);
    curNode = pBVar1;
  }
  (this->head).ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  (this->lastFoundIndex).ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>_>::
  WriteBarrierSet(&this->lastUsedNodePrevNextField,&this->head);
  return;
}

Assistant:

void
BVSparse<TAllocator>::ClearAll()
{
    BVSparseNode* nextNode;
    for(BVSparseNode * node = this->head; node != 0 ; node = nextNode)
    {
        nextNode = node->next;
        QueueInFreeList(node);
    }
    this->head = nullptr;
    this->lastFoundIndex = nullptr;
    this->lastUsedNodePrevNextField = &this->head;
}